

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

void __thiscall
jbcoin::STObject::setFieldUsingAssignment<jbcoin::STAmount>
          (STObject *this,SField *field,STAmount *value)

{
  int iVar1;
  STBase *pSVar2;
  STAmount *this_00;
  
  pSVar2 = getPField(this,field,true);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
  if (iVar1 == 0) {
    pSVar2 = makeFieldPresent(this,field);
    if (pSVar2 == (STBase *)0x0) goto LAB_001fcf28;
  }
  this_00 = (STAmount *)__dynamic_cast(pSVar2,&STBase::typeinfo,&STAmount::typeinfo,0);
  if (this_00 != (STAmount *)0x0) {
    STAmount::operator=(this_00,value);
    return;
  }
LAB_001fcf28:
  Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
}

Assistant:

void setFieldUsingAssignment (SField const& field, T const& value)
    {
        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        (*cf) = value;
    }